

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SpawnMissileXYZ
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  AActor *pAVar5;
  VMValue *pVVar6;
  int iVar7;
  VMValue *pVVar8;
  PClassActor *type;
  AActor *dest;
  char *pcVar9;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_0043398b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00433963:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043398b:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1962,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_00433752;
    bVar4 = DObject::IsKindOf((DObject *)pAVar5,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043398b;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_00433963;
LAB_00433752:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar9 = "(paramnum) < numparam";
LAB_004339b3:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1963,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar9 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004339b3;
  }
  if ((uint)numparam < 3) {
    pcVar9 = "(paramnum) < numparam";
LAB_004339db:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1964,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar9 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004339db;
  }
  if (numparam == 3) {
    pcVar9 = "(paramnum) < numparam";
LAB_00433a03:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1965,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar9 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_00433a03;
  }
  if ((uint)numparam < 5) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_00433a22;
  }
  if (param[4].field_0.field_3.Type != '\x03') {
LAB_0043396c:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00433a22;
  }
  pvVar1 = param[1].field_0.field_1.a;
  pvVar2 = param[2].field_0.field_1.a;
  pvVar3 = param[3].field_0.field_1.a;
  dest = (AActor *)param[4].field_0.field_1.a;
  if (param[4].field_0.field_1.atag == 1) {
    if (dest == (AActor *)0x0) goto LAB_004337f1;
LAB_00433806:
    bVar4 = DObject::IsKindOf((DObject *)dest,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar9 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00433a22:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1966,
                    "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (dest != (AActor *)0x0) goto LAB_0043396c;
LAB_004337f1:
    NullParam("\"dest\"");
    dest = (AActor *)param[4].field_0.field_1.a;
    if (dest != (AActor *)0x0) goto LAB_00433806;
    dest = (AActor *)0x0;
  }
  if (numparam == 5) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_00433a41;
  }
  if (param[5].field_0.field_3.Type != '\x03') {
LAB_00433978:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00433a41:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1967,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[5].field_0.field_1.a;
  if (param[5].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_00433874;
    bVar4 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar4) {
      pcVar9 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_00433a41;
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_00433978;
LAB_00433874:
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 7) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[6].field_0.field_3.Type != '\0') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_00433a88;
    }
    bVar4 = pVVar8[6].field_0.i != 0;
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_00433a88:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1968,
                    "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar4 = param[6].field_0.i != 0;
    if (numparam != 7) {
      if ((param[7].field_0.field_3.Type == '\x03') &&
         ((pVVar6 = param + 7, param[7].field_0.field_1.atag == 1 ||
          ((pVVar6->field_0).field_1.a == (void *)0x0)))) goto LAB_004338f2;
      pcVar9 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_00433aa7;
    }
    pVVar8 = defaultparam->Array;
  }
  if ((pVVar8[7].field_0.field_3.Type == '\x03') &&
     ((pVVar6 = pVVar8 + 7, pVVar8[7].field_0.field_1.atag == 1 ||
      ((pVVar6->field_0).field_1.a == (void *)0x0)))) {
LAB_004338f2:
    local_48.X = (double)pvVar1;
    local_48.Y = (double)pvVar2;
    local_48.Z = (double)pvVar3;
    pAVar5 = P_SpawnMissileXYZ(&local_48,pAVar5,dest,type,bVar4,
                               (AActor *)(pVVar6->field_0).field_1.a);
    if (numret < 1) {
      iVar7 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x196a,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar7 = 1;
      VMReturn::SetPointer(ret,pAVar5,1);
    }
    return iVar7;
  }
  pcVar9 = 
  "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
  ;
LAB_00433aa7:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1969,
                "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileXYZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_BOOL_DEF(check);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileXYZ(DVector3(x,y,z), self, dest, type, check, owner));
}